

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_scan.hpp
# Opt level: O2

void __thiscall
duckdb::AlpScanState<float>::LoadVector<false>(AlpScanState<float> *this,float *value_buffer)

{
  bitpacking_width_t width;
  data_ptr_t pdVar1;
  ushort uVar2;
  idx_t __n;
  data_ptr_t __src;
  idx_t count;
  
  (this->vector_state).index = 0;
  pdVar1 = this->metadata_ptr;
  this->metadata_ptr = pdVar1 + -4;
  count = this->count - this->total_value_count;
  if (0x3ff < count) {
    count = 0x400;
  }
  pdVar1 = this->segment_data + *(uint *)(pdVar1 + -4);
  __src = pdVar1 + 0xd;
  (this->vector_state).v_exponent = *pdVar1;
  (this->vector_state).v_factor = pdVar1[1];
  uVar2 = *(ushort *)(pdVar1 + 2);
  (this->vector_state).exceptions_count = uVar2;
  (this->vector_state).frame_of_reference = *(uint64_t *)(pdVar1 + 4);
  width = pdVar1[0xc];
  (this->vector_state).bit_width = width;
  if (width != '\0') {
    __n = BitpackingPrimitives::GetRequiredSize(count,width);
    switchD_00917c1c::default((this->vector_state).for_encoded,__src,__n);
    __src = __src + __n;
    uVar2 = (this->vector_state).exceptions_count;
  }
  if (uVar2 != 0) {
    switchD_00917c1c::default((this->vector_state).exceptions,__src,(ulong)uVar2 << 2);
    uVar2 = (this->vector_state).exceptions_count;
    switchD_00917c1c::default
              ((this->vector_state).exceptions_positions,__src + (ulong)uVar2 * 4,
               (ulong)((uint)uVar2 * 2));
  }
  AlpVectorState<float>::LoadValues<false>(&this->vector_state,value_buffer,count);
  return;
}

Assistant:

void LoadVector(T *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.v_exponent = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::EXPONENT_SIZE;

		vector_state.v_factor = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::FACTOR_SIZE;

		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpConstants::EXCEPTIONS_COUNT_SIZE;

		vector_state.frame_of_reference = Load<uint64_t>(vector_ptr);
		vector_ptr += AlpConstants::FOR_SIZE;

		vector_state.bit_width = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::BIT_WIDTH_SIZE;

		D_ASSERT(vector_state.exceptions_count <= vector_size);
		D_ASSERT(vector_state.v_exponent <= AlpTypedConstants<T>::MAX_EXPONENT);
		D_ASSERT(vector_state.v_factor <= vector_state.v_exponent);
		D_ASSERT(vector_state.bit_width <= sizeof(uint64_t) * 8);

		if (vector_state.bit_width > 0) {
			auto bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.bit_width);
			memcpy(vector_state.for_encoded, (void *)vector_ptr, bp_size);
			vector_ptr += bp_size;
		}

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr, sizeof(EXACT_TYPE) * vector_state.exceptions_count);
			vector_ptr += sizeof(EXACT_TYPE) * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}